

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

void sptk::PrintErrorMessage(string *program_name,ostringstream *message)

{
  ostream *poVar1;
  ostringstream stream;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,(string *)program_name);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(poVar1,local_1b0);
  poVar1 = std::operator<<(poVar1,"!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cerr,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void PrintErrorMessage(const std::string& program_name,
                       const std::ostringstream& message) {
  std::ostringstream stream;
  stream << program_name << ": " << message.str() << "!" << std::endl;
  std::cerr << stream.str();
}